

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O2

void __thiscall
icu_63::DateTimePatternGenerator::getAppendName
          (DateTimePatternGenerator *this,UDateTimePatternField field,UnicodeString *value)

{
  icu_63::UnicodeString::operator=(value,L'\'');
  icu_63::UnicodeString::operator+=
            (value,(UnicodeString *)(&this->field_0x508 + (ulong)field * 0xc0));
  icu_63::UnicodeString::operator+=(value,L'\'');
  return;
}

Assistant:

void
DateTimePatternGenerator::getAppendName(UDateTimePatternField field, UnicodeString& value) {
    value = SINGLE_QUOTE;
    value += fieldDisplayNames[field][UDATPG_WIDTH_APPENDITEM];
    value += SINGLE_QUOTE;
}